

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

exr_result_t default_write_chunk(exr_encode_pipeline_t *encode)

{
  exr_result_t eVar1;
  
  if (encode != (exr_encode_pipeline_t *)0x0) {
    switch((encode->chunk).type) {
    case '\0':
      eVar1 = exr_write_scanline_chunk
                        (encode->context,encode->part_index,(encode->chunk).start_y,
                         encode->compressed_buffer,encode->compressed_bytes);
      return eVar1;
    case '\x01':
      eVar1 = exr_write_tile_chunk
                        (encode->context,encode->part_index,(encode->chunk).start_x,
                         (encode->chunk).start_y,(uint)(encode->chunk).level_x,
                         (uint)(encode->chunk).level_y,encode->compressed_buffer,
                         encode->compressed_bytes);
      return eVar1;
    case '\x02':
      if ((encode->packed_sample_count_table != (void *)0x0) &&
         (encode->packed_sample_count_bytes != 0)) {
        eVar1 = exr_write_deep_scanline_chunk
                          (encode->context,encode->part_index,(encode->chunk).start_y,
                           encode->compressed_buffer,encode->compressed_bytes,encode->packed_bytes,
                           encode->packed_sample_count_table,encode->packed_sample_count_bytes);
        return eVar1;
      }
      break;
    case '\x03':
      if ((encode->packed_sample_count_table != (void *)0x0) &&
         (encode->packed_sample_count_bytes != 0)) {
        eVar1 = exr_write_deep_tile_chunk
                          (encode->context,encode->part_index,(encode->chunk).start_x,
                           (encode->chunk).start_y,(uint)(encode->chunk).level_x,
                           (uint)(encode->chunk).level_y,encode->compressed_buffer,
                           encode->compressed_bytes,encode->packed_bytes,
                           encode->packed_sample_count_table,encode->packed_sample_count_bytes);
        return eVar1;
      }
    }
  }
  return 3;
}

Assistant:

static exr_result_t
default_write_chunk (exr_encode_pipeline_t* encode)
{
    exr_result_t rv;

    if (!encode) return EXR_ERR_INVALID_ARGUMENT;

    switch (encode->chunk.type)
    {
        case EXR_STORAGE_SCANLINE:
            rv = exr_write_scanline_chunk (
                EXR_CONST_CAST (exr_context_t, encode->context),
                encode->part_index,
                encode->chunk.start_y,
                encode->compressed_buffer,
                encode->compressed_bytes);
            break;
        case EXR_STORAGE_TILED:
            rv = exr_write_tile_chunk (
                EXR_CONST_CAST (exr_context_t, encode->context),
                encode->part_index,
                encode->chunk.start_x,
                encode->chunk.start_y,
                encode->chunk.level_x,
                encode->chunk.level_y,
                encode->compressed_buffer,
                encode->compressed_bytes);
            break;
        case EXR_STORAGE_DEEP_SCANLINE:
            if (!encode->packed_sample_count_table ||
                encode->packed_sample_count_bytes == 0)
                return EXR_ERR_INVALID_ARGUMENT;
            rv = exr_write_deep_scanline_chunk (
                EXR_CONST_CAST (exr_context_t, encode->context),
                encode->part_index,
                encode->chunk.start_y,
                encode->compressed_buffer,
                encode->compressed_bytes,
                encode->packed_bytes,
                encode->packed_sample_count_table,
                encode->packed_sample_count_bytes);
            break;
        case EXR_STORAGE_DEEP_TILED:
            if (!encode->packed_sample_count_table ||
                encode->packed_sample_count_bytes == 0)
                return EXR_ERR_INVALID_ARGUMENT;
            rv = exr_write_deep_tile_chunk (
                EXR_CONST_CAST (exr_context_t, encode->context),
                encode->part_index,
                encode->chunk.start_x,
                encode->chunk.start_y,
                encode->chunk.level_x,
                encode->chunk.level_y,
                encode->compressed_buffer,
                encode->compressed_bytes,
                encode->packed_bytes,
                encode->packed_sample_count_table,
                encode->packed_sample_count_bytes);
            break;
        case EXR_STORAGE_LAST_TYPE:
        default: rv = EXR_ERR_INVALID_ARGUMENT; break;
    }
    return rv;
}